

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int load_obj(em8051 *aCPU,char *aFilename)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  FILE *__stream;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  
  iVar8 = -1;
  if (((aFilename != (char *)0x0) && (*aFilename != '\0')) &&
     (__stream = fopen(aFilename,"r"), __stream != (FILE *)0x0)) {
    iVar2 = fgetc(__stream);
    iVar8 = -2;
    if (iVar2 == 0x3a) {
      do {
        iVar2 = feof(__stream);
        if (iVar2 != 0) {
          iVar8 = -5;
          goto LAB_001043b1;
        }
        uVar3 = readbyte((FILE *)__stream);
        iVar2 = readbyte((FILE *)__stream);
        uVar4 = readbyte((FILE *)__stream);
        iVar5 = readbyte((FILE *)__stream);
        if (iVar5 == 0) {
          uVar6 = iVar2 << 8 | uVar4;
          iVar2 = ((int)uVar6 >> 8) + uVar4 + uVar3;
          if (0 < (int)uVar3) {
            lVar7 = (long)(int)uVar6;
            uVar9 = (ulong)uVar3;
            do {
              iVar5 = readbyte((FILE *)__stream);
              iVar2 = iVar2 + iVar5;
              aCPU->mCodeMem[lVar7] = (uchar)iVar5;
              lVar7 = lVar7 + 1;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
          }
          uVar3 = readbyte((FILE *)__stream);
          if (uVar3 != (-iVar2 & 0xffU)) {
            iVar8 = -4;
            goto LAB_0010439f;
          }
          do {
            iVar2 = fgetc(__stream);
            bVar1 = true;
            if (iVar2 == 0x3a) break;
            iVar2 = feof(__stream);
          } while (iVar2 == 0);
        }
        else {
          bVar1 = false;
          iVar8 = 0;
          if (iVar5 != 1) {
            iVar8 = -3;
LAB_0010439f:
            bVar1 = false;
          }
        }
      } while (bVar1);
    }
    else {
LAB_001043b1:
      fclose(__stream);
    }
  }
  return iVar8;
}

Assistant:

int load_obj(struct em8051 *aCPU, char *aFilename)
{
    FILE *f;    
    if (aFilename == 0 || aFilename[0] == 0)
        return -1;
    f = fopen(aFilename, "r");
    if (!f) return -1;
    if (fgetc(f) != ':')
    {
    	  fclose(f);
        return -2; // unsupported file format
    }
    while (!feof(f))
    {
        int recordlength;
        int address;
        int recordtype;
        int checksum;
        int i;
        recordlength = readbyte(f);
        address = readbyte(f);
        address <<= 8;
        address |= readbyte(f);
        recordtype = readbyte(f);
        if (recordtype == 1)
            return 0; // we're done
        if (recordtype != 0)
            return -3; // unsupported record type
        checksum = recordtype + recordlength + (address & 0xff) + (address >> 8); // final checksum = 1 + not(checksum)
        for (i = 0; i < recordlength; i++)
        {
            int data = readbyte(f);
            checksum += data;
            aCPU->mCodeMem[address + i] = data;
        }
        i = readbyte(f);
        checksum &= 0xff;
        checksum = 256 - checksum;
        if (i != (checksum & 0xff))
            return -4; // checksum failure
        while (fgetc(f) != ':' && !feof(f)) {} // skip newline        
    }
	  fclose(f);
    return -5;
}